

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_jump(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 dest;
  TCGv_i32 val;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  dest = gen_lea(env,s,insn,2);
  if (dest == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    if ((insn & 0x40) == 0) {
      val = tcg_const_i32_m68k(tcg_ctx_00,s->pc);
      gen_push(s,val);
    }
    gen_jmp(s,dest);
  }
  return;
}

Assistant:

DISAS_INSN(jump)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    /*
     * Load the target address first to ensure correct exception
     * behavior.
     */
    tmp = gen_lea(env, s, insn, OS_LONG);
    if (IS_NULL_QREG(tmp)) {
        gen_addr_fault(s);
        return;
    }
    if ((insn & 0x40) == 0) {
        /* jsr */
        gen_push(s, tcg_const_i32(tcg_ctx, s->pc));
    }
    gen_jmp(s, tmp);
}